

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.h
# Opt level: O2

void __thiscall ON_SubDFace::ON_SubDFace(ON_SubDFace *this)

{
  double dVar1;
  
  (this->super_ON_SubDComponentBase).m_subd_point1 = (ON_SubDVertex *)0x0;
  (this->super_ON_SubDComponentBase).m_id = 0;
  (this->super_ON_SubDComponentBase).m_archive_id = 0;
  (this->super_ON_SubDComponentBase).m_status = ON_ComponentStatus::NoneSet;
  (this->super_ON_SubDComponentBase).m_saved_points_flags = '\0';
  (this->super_ON_SubDComponentBase).m_level = '\0';
  (this->super_ON_SubDComponentBase).m_group_id = 0;
  this->m_reserved1 = 0;
  this->m_pack_id = 0;
  this->m_prev_face = (ON_SubDFace *)0x0;
  this->m_next_face = (ON_SubDFace *)0x0;
  dVar1 = ON_DBL_QNAN;
  this->m_pack_rect_origin[0] = ON_DBL_QNAN;
  this->m_pack_rect_origin[1] = 0.0;
  this->m_pack_rect_size[0] = dVar1;
  this->m_pack_status_bits = '\0';
  this->m_texture_status_bits = '\0';
  this->m_material_channel_index = 0;
  this->m_pack_rect_size[1] = 0.0;
  this->m_reserved2 = 0;
  this->m_reserved3 = 0;
  (this->m_per_face_color).field_0 = ON_Color::UnsetColor.field_0;
  this->m_level_zero_face_id = 0;
  this->m_edge_count = 0;
  this->m_edgex_capacity = 0;
  this->m_edgex = (ON_SubDEdgePtr *)0x0;
  this->m_texture_points = (ON_3dPoint *)0x0;
  this->m_mesh_fragments = (ON_SubDMeshFragment *)0x0;
  return;
}

Assistant:

~ON_SubDComponentBase() = default;